

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FailoverStrategy.cpp
# Opt level: O3

void __thiscall xmrig::FailoverStrategy::add(FailoverStrategy *this,Pool *pool)

{
  pointer *pppIVar1;
  iterator __position;
  IClient *pIVar2;
  IClient *client;
  IClient *local_18;
  
  pIVar2 = Pool::createClient(pool,(int)((ulong)((long)(this->m_pools).
                                                                                                              
                                                  super__Vector_base<xmrig::IClient_*,_std::allocator<xmrig::IClient_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                (long)(this->m_pools).
                                                                                                            
                                                  super__Vector_base<xmrig::IClient_*,_std::allocator<xmrig::IClient_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 3),
                              &this->super_IClientListener);
  local_18 = pIVar2;
  (*pIVar2->_vptr_IClient[0x17])(pIVar2,(ulong)(uint)this->m_retries);
  (*pIVar2->_vptr_IClient[0x18])(pIVar2,(long)this->m_retryPause * 1000);
  (*pIVar2->_vptr_IClient[0x16])(pIVar2,(ulong)this->m_quiet);
  __position._M_current =
       (this->m_pools).super__Vector_base<xmrig::IClient_*,_std::allocator<xmrig::IClient_*>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->m_pools).super__Vector_base<xmrig::IClient_*,_std::allocator<xmrig::IClient_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<xmrig::IClient*,std::allocator<xmrig::IClient*>>::
    _M_realloc_insert<xmrig::IClient*const&>
              ((vector<xmrig::IClient*,std::allocator<xmrig::IClient*>> *)&this->m_pools,__position,
               &local_18);
  }
  else {
    *__position._M_current = pIVar2;
    pppIVar1 = &(this->m_pools).
                super__Vector_base<xmrig::IClient_*,_std::allocator<xmrig::IClient_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppIVar1 = *pppIVar1 + 1;
  }
  return;
}

Assistant:

void xmrig::FailoverStrategy::add(const Pool &pool)
{
    IClient *client = pool.createClient(static_cast<int>(m_pools.size()), this);

    client->setRetries(m_retries);
    client->setRetryPause(m_retryPause * 1000);
    client->setQuiet(m_quiet);

    m_pools.push_back(client);
}